

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.cpp
# Opt level: O1

void __thiscall lambda::parse_from::helper::comment(helper *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  int iVar2;
  undefined8 *puVar3;
  string_view s;
  Shared_string local_30;
  
  iVar2 = std::istream::get();
LAB_00103345:
  do {
    if (iVar2 == 0x28) {
      iVar2 = std::istream::peek();
      if (iVar2 == 0x2a) {
        std::istream::get();
        comment(this);
        iVar2 = 0x28;
        goto LAB_00103345;
      }
    }
    else if ((iVar2 == 0x2a) && (iVar2 = std::istream::peek(), iVar2 == 0x29)) {
      std::istream::get();
      return;
    }
    iVar2 = std::istream::get();
    if (iVar2 == -1) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x20);
      s._M_str = "unexpected end of file";
      s._M_len = 0x16;
      ublib::Shared_string::Shared_string(&local_30,s);
      _Var1._M_pi = local_30.underlying_.
                    super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      *puVar3 = &PTR__Parse_error_00109b70;
      puVar3[1] = local_30.length_;
      puVar3[2] = local_30.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
      puVar3[3] = 0;
      local_30.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      puVar3[3] = _Var1._M_pi;
      local_30.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      __cxa_throw(puVar3,&Parse_error::typeinfo,Parse_error::~Parse_error);
    }
  } while( true );
}

Assistant:

void comment() {
      auto ch = inp.get();
      for (;;) {
        if (ch == '*' and inp.peek() == ')') {
          inp.get();
          return;
        } else if (ch == '(' and inp.peek() == '*') {
          inp.get();
          comment();
        } else {
          ch = inp.get();
          if (ch == eof) {
            throw Parse_error("unexpected end of file");
          }
        }
      }
    }